

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_compute_branch1_r6
               (DisasContext_conflict6 *ctx,uint32_t op,int32_t ft,int32_t offset,int delayslot_size
               )

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  target_ulong tVar1;
  TCGv_i64 t0;
  target_ulong btarget;
  TCGContext_conflict6 *tcg_ctx;
  int delayslot_size_local;
  int32_t offset_local;
  int32_t ft_local;
  uint32_t op_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  if ((ctx->hflags & 0x87f800) == 0) {
    gen_load_fpr64(ctx,t,ft);
    tcg_gen_andi_i64_mips64el(tcg_ctx_00,t,t,1);
    tVar1 = addr_add(ctx,(ctx->base).pc_next + 4,(long)offset);
    if (op == 0x45200000) {
      tcg_gen_xori_i64_mips64el(tcg_ctx_00,t,t,1);
      ctx->hflags = ctx->hflags | 0x1000;
    }
    else {
      if (op != 0x45a00000) {
        generate_exception_end(ctx,0x14);
        goto LAB_00d33936;
      }
      ctx->hflags = ctx->hflags | 0x1000;
    }
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->bcond,t);
    ctx->btarget = tVar1;
    if (delayslot_size == 2) {
      ctx->hflags = ctx->hflags | 0x8000;
    }
    else if (delayslot_size == 4) {
      ctx->hflags = ctx->hflags | 0x10000;
    }
  }
  else {
    generate_exception_end(ctx,0x14);
  }
LAB_00d33936:
  tcg_temp_free_i64(tcg_ctx_00,t);
  return;
}

Assistant:

static void gen_compute_branch1_r6(DisasContext *ctx, uint32_t op,
                                   int32_t ft, int32_t offset,
                                   int delayslot_size)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btarget;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
#ifdef MIPS_DEBUG_DISAS
        LOG_DISAS("Branch in delay / forbidden slot at PC 0x" TARGET_FMT_lx
                  "\n", ctx->base.pc_next);
#endif
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    gen_load_fpr64(ctx, t0, ft);
    tcg_gen_andi_i64(tcg_ctx, t0, t0, 1);

    btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);

    switch (op) {
    case OPC_BC1EQZ:
        tcg_gen_xori_i64(tcg_ctx, t0, t0, 1);
        ctx->hflags |= MIPS_HFLAG_BC;
        break;
    case OPC_BC1NEZ:
        /* t0 already set */
        ctx->hflags |= MIPS_HFLAG_BC;
        break;
    default:
        MIPS_INVAL("cp1 cond branch");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    tcg_gen_trunc_i64_tl(tcg_ctx, tcg_ctx->bcond, t0);

    ctx->btarget = btarget;

    switch (delayslot_size) {
    case 2:
        ctx->hflags |= MIPS_HFLAG_BDS16;
        break;
    case 4:
        ctx->hflags |= MIPS_HFLAG_BDS32;
        break;
    }

out:
    tcg_temp_free_i64(tcg_ctx, t0);
}